

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluDefs.cpp
# Opt level: O2

void eglu::checkError(deUint32 err,char *message,char *file,int line)

{
  ostream *poVar1;
  BadAllocError *this;
  Enum<int,_2UL> local_1c0 [2];
  ostringstream desc;
  
  if (err == 0x3000) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
  poVar1 = std::operator<<((ostream *)&desc,"Got ");
  local_1c0[0].m_getName = getErrorName;
  local_1c0[0].m_value = err;
  tcu::Format::Enum<int,_2UL>::toStream(local_1c0,poVar1);
  if (message != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&desc,": ");
    std::operator<<(poVar1,message);
  }
  this = (BadAllocError *)__cxa_allocate_exception(0x38);
  if (err == 0x3003) {
    std::__cxx11::stringbuf::str();
    BadAllocError::BadAllocError(this,(char *)local_1c0[0].m_getName,(char *)0x0,file,line);
    __cxa_throw(this,&BadAllocError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::stringbuf::str();
  Error::Error((Error *)this,err,(char *)local_1c0[0].m_getName,(char *)0x0,file,line);
  __cxa_throw(this,&Error::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void checkError (deUint32 err, const char* message, const char* file, int line)
{
	if (err != EGL_SUCCESS)
	{
		std::ostringstream desc;
		desc << "Got " << eglu::getErrorStr(err);
		if (message)
			desc << ": " << message;

		if (err == EGL_BAD_ALLOC)
			throw BadAllocError(desc.str().c_str(), DE_NULL, file, line);
		else
			throw Error(err, desc.str().c_str(), DE_NULL, file, line);
	}
}